

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanSpace(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  
  lVar6 = 0;
  do {
    lVar4 = (this->putStack).tos;
    if (lVar4 == -1) {
      lVar4 = this->readBufferPos;
      if (lVar4 < (this->readBuffer).d.size) {
        this->readBufferPos = lVar4 + 1;
        uVar7 = (uint)(ushort)(this->readBuffer).d.ptr[lVar4];
      }
      else {
        uVar7 = getChar_helper(this);
      }
    }
    else {
      if (this->atEnd != false) {
        return lVar6;
      }
      uVar7 = (this->putStack).data[lVar4];
      (this->putStack).tos = lVar4 + -1;
    }
    if ((int)uVar7 < 0xd) {
      if (uVar7 != 9) {
        if (uVar7 == 10) goto LAB_0039b555;
        if (uVar7 != 0xffffffff) {
LAB_0039b591:
          puVar3 = (this->putStack).data;
          lVar5 = (this->putStack).tos;
          lVar4 = lVar5 + 1;
          lVar1 = (this->putStack).cap;
          if (lVar1 <= lVar4) {
            lVar5 = lVar5 + 2;
            lVar4 = lVar1 * 2;
            if (lVar5 != lVar4 && SBORROW8(lVar5,lVar4) == lVar5 + lVar1 * -2 < 0) {
              lVar4 = lVar5;
            }
            (this->putStack).cap = lVar4;
            puVar3 = (uint *)realloc(puVar3,lVar4 << 2);
            (this->putStack).data = puVar3;
            if (puVar3 == (uint *)0x0) {
LAB_0039b667:
              qBadAlloc();
            }
            lVar4 = (this->putStack).tos + 1;
          }
          (this->putStack).tos = lVar4;
          puVar3[lVar4] = uVar7;
        }
        return lVar6;
      }
    }
    else {
      if (uVar7 == 0x20) goto LAB_0039b576;
      if (uVar7 != 0xd) goto LAB_0039b591;
      lVar4 = (this->putStack).tos;
      if (lVar4 == -1) {
        if (this->readBufferPos < (this->readBuffer).d.size) {
          uVar2 = (uint)(ushort)(this->readBuffer).d.ptr[this->readBufferPos];
          goto LAB_0039b526;
        }
        uVar2 = getChar_helper(this);
        if (uVar2 != 0xffffffff) {
          this->readBufferPos = this->readBufferPos + -1;
          goto LAB_0039b526;
        }
LAB_0039b5f6:
        puVar3 = (this->putStack).data;
        lVar5 = (this->putStack).tos;
        lVar4 = lVar5 + 1;
        lVar1 = (this->putStack).cap;
        if (lVar1 <= lVar4) {
          lVar5 = lVar5 + 2;
          lVar4 = lVar1 * 2;
          if (lVar5 != lVar4 && SBORROW8(lVar5,lVar4) == lVar5 + lVar1 * -2 < 0) {
            lVar4 = lVar5;
          }
          (this->putStack).cap = lVar4;
          puVar3 = (uint *)realloc(puVar3,lVar4 << 2);
          (this->putStack).data = puVar3;
          if (puVar3 == (uint *)0x0) goto LAB_0039b667;
          lVar4 = (this->putStack).tos + 1;
        }
        (this->putStack).tos = lVar4;
        puVar3[lVar4] = 0xd;
        return lVar6;
      }
      uVar2 = (this->putStack).data[lVar4];
LAB_0039b526:
      if (uVar2 == 10) {
        lVar4 = (this->putStack).tos;
        if (lVar4 == -1) {
          this->readBufferPos = this->readBufferPos + 1;
        }
        else {
          (this->putStack).tos = lVar4 + -1;
        }
      }
      else if (uVar2 == 0xffffffff) goto LAB_0039b5f6;
LAB_0039b555:
      this->lineNumber = this->lineNumber + 1;
      this->lastLineStart = this->readBufferPos + this->characterOffset;
      uVar7 = 10;
    }
LAB_0039b576:
    QString::append(&this->textBuffer,(QChar)(char16_t)uVar7);
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanSpace()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        switch (c) {
        case '\r':
            if ((c = filterCarriageReturn()) == 0)
                return n;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case ' ':
        case '\t':
            textBuffer += QChar(c);
            ++n;
            break;
        default:
            putChar(c);
            return n;
        }
    }
    return n;
}